

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::
expectThrowIfSDLCreateRendererFailedDuringWindowCreation(SDLGraphicsSystemTests *this)

{
  bool bVar1;
  WrapperMock *this_00;
  MockSpec<int_(unsigned_int)> *this_01;
  TypedExpectation<int_(unsigned_int)> *this_02;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_03;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_04;
  PtrDeleterMock *this_05;
  MockSpec<void_(SDL_Window_*)> *this_06;
  StrictMock<solitaire::SDL::WrapperMock> *__return_storage_ptr__;
  MockSpec<void_()> *this_07;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  char *pcVar2;
  AssertHelper local_1f0;
  Message local_1e8 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 local_1a8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  MockSpec<void_()> local_180;
  WithoutMatchers local_169;
  Matcher<SDL_Window_*> local_168;
  MockSpec<void_(SDL_Window_*)> local_150;
  PolymorphicAction local_129;
  Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  local_128;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_108;
  ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> local_e0;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  local_b8;
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  local_a8;
  ReturnAction<int> local_88;
  Action<int_(unsigned_int)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_int> local_48;
  MockSpec<int_(unsigned_int)> local_30;
  SDLGraphicsSystemTests *local_10;
  SDLGraphicsSystemTests *this_local;
  
  local_10 = this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*(&this->sdlMock)
             ->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher(&local_48,0x20);
  SDL::WrapperMock::gmock_init(&local_30,this_00,&local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(unsigned_int)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_02 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x5a,"*sdlMock","init(0x00000020u)");
  testing::Return<int>((testing *)&local_88,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce(this_02,&local_78);
  testing::Action<int_(unsigned_int)>::~Action(&local_78);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
  testing::internal::MockSpec<int_(unsigned_int)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_int>::~Matcher(&local_48);
  this_03 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_108,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            (&local_e0,(testing *)&local_108,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)&local_b8,&local_e0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_a8,(ReturnAction *)&local_b8);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_03,&local_a8);
  testing::
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::~Action(&local_a8);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  ::~ReturnAction(&local_b8);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::~ByMoveWrapper
            (&local_e0);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_108);
  this_04 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  testing::ReturnNull();
  testing::PolymorphicAction::operator_cast_to_Action(&local_128,&local_129);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_04,&local_128);
  testing::
  Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::~Action(&local_128);
  this_05 = &std::
             __shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->ptrDeleterMock)->super_PtrDeleterMock;
  testing::Matcher<SDL_Window_*>::Matcher(&local_168,(Snapshot *)0x1);
  SDL::PtrDeleterMock::gmock_windowDeleter(&local_150,this_05,&local_168);
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::MockSpec<void_(SDL_Window_*)>::operator()
                      (&local_150,&local_169,(void *)0x0);
  pcVar2 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
  ;
  testing::internal::MockSpec<void_(SDL_Window_*)>::InternalExpectedAt
            (this_06,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5e,"*ptrDeleterMock","windowDeleter(windowPtr)");
  testing::internal::MockSpec<void_(SDL_Window_*)>::~MockSpec(&local_150);
  testing::Matcher<SDL_Window_*>::~Matcher(&local_168);
  __return_storage_ptr__ =
       mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*(&this->sdlMock);
  local_180.function_mocker_ =
       (FunctionMocker<void_()> *)
       SDL::WrapperMock::gmock_quit
                 ((MockSpec<void_()> *)__return_storage_ptr__,(WrapperMock *)pcVar2);
  testing::internal::GetWithoutMatchers();
  this_07 = testing::internal::MockSpec<void_()>::operator()
                      (&local_180,(WithoutMatchers *)(gtest_msg.value.field_2._M_local_buf + 0xf),
                       (void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_07,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5f,"*sdlMock","quit()");
  memset(local_1a8,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_1a8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_1a8);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      SDLGraphicsSystem::createWindow
                (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_002d949b;
    std::__cxx11::string::operator=
              ((string *)local_1a8,
               "Expected: system.createWindow(title, windowWidth, windowHeight) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_1e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_1f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,100,pcVar2);
  testing::internal::AssertHelper::operator=(&local_1f0,local_1e8);
  testing::internal::AssertHelper::~AssertHelper(&local_1f0);
  testing::Message::~Message(local_1e8);
LAB_002d949b:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_1a8);
  return;
}

Assistant:

void expectThrowIfSDLCreateRendererFailedDuringWindowCreation() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr).WillOnce(ReturnNull());
        EXPECT_CALL(*ptrDeleterMock, windowDeleter(windowPtr));
        EXPECT_CALL(*sdlMock, quit());

        EXPECT_THROW(
            system.createWindow(title, windowWidth, windowHeight),
            std::runtime_error
        );
    }